

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShadingLanguage420PackTests.cpp
# Opt level: O1

bool __thiscall
gl4cts::GLSL420Pack::QualifierOrderUniformTest::testInit(QualifierOrderUniformTest *this)

{
  vector<std::vector<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>,_std::allocator<std::vector<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>_>_>
  *this_00;
  bool bVar1;
  vector<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
  *pvVar2;
  iterator iVar3;
  pointer pvVar4;
  QUALIFIERS local_1c;
  
  bVar1 = (this->super_GLSLTestBase).super_TestBase.m_is_explicit_uniform_location;
  if (bVar1 != false) {
    this_00 = &this->m_test_cases;
    std::
    vector<std::vector<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>,_std::allocator<std::vector<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>_>_>
    ::resize(this_00,4);
    pvVar2 = (this->m_test_cases).
             super__Vector_base<std::vector<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>,_std::allocator<std::vector<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_1c = QUAL_HIGHP;
    iVar3._M_current =
         (pvVar2->
         super__Vector_base<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
         )._M_impl.super__Vector_impl_data._M_finish;
    if (iVar3._M_current ==
        (pvVar2->
        super__Vector_base<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
        )._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
      ::_M_realloc_insert<gl4cts::GLSL420Pack::Utils::QUALIFIERS>(pvVar2,iVar3,&local_1c);
    }
    else {
      *iVar3._M_current = QUAL_HIGHP;
      (pvVar2->
      super__Vector_base<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
      )._M_impl.super__Vector_impl_data._M_finish = iVar3._M_current + 1;
    }
    pvVar2 = (this_00->
             super__Vector_base<std::vector<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>,_std::allocator<std::vector<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    local_1c = QUAL_UNIFORM;
    iVar3._M_current =
         (pvVar2->
         super__Vector_base<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
         )._M_impl.super__Vector_impl_data._M_finish;
    if (iVar3._M_current ==
        (pvVar2->
        super__Vector_base<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
        )._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
      ::_M_realloc_insert<gl4cts::GLSL420Pack::Utils::QUALIFIERS>(pvVar2,iVar3,&local_1c);
    }
    else {
      *iVar3._M_current = QUAL_UNIFORM;
      (pvVar2->
      super__Vector_base<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
      )._M_impl.super__Vector_impl_data._M_finish = iVar3._M_current + 1;
    }
    pvVar2 = (this_00->
             super__Vector_base<std::vector<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>,_std::allocator<std::vector<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    local_1c = QUAL_LOCATION;
    iVar3._M_current =
         (pvVar2->
         super__Vector_base<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
         )._M_impl.super__Vector_impl_data._M_finish;
    if (iVar3._M_current ==
        (pvVar2->
        super__Vector_base<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
        )._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
      ::_M_realloc_insert<gl4cts::GLSL420Pack::Utils::QUALIFIERS>(pvVar2,iVar3,&local_1c);
    }
    else {
      *iVar3._M_current = QUAL_LOCATION;
      (pvVar2->
      super__Vector_base<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
      )._M_impl.super__Vector_impl_data._M_finish = iVar3._M_current + 1;
    }
    pvVar4 = (this_00->
             super__Vector_base<std::vector<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>,_std::allocator<std::vector<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    local_1c = QUAL_LOWP;
    iVar3._M_current =
         *(pointer *)
          ((long)&pvVar4[1].
                  super__Vector_base<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
                  ._M_impl.super__Vector_impl_data + 8);
    if (iVar3._M_current ==
        *(pointer *)
         ((long)&pvVar4[1].
                 super__Vector_base<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
                 ._M_impl.super__Vector_impl_data + 0x10)) {
      std::
      vector<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
      ::_M_realloc_insert<gl4cts::GLSL420Pack::Utils::QUALIFIERS>(pvVar4 + 1,iVar3,&local_1c);
    }
    else {
      *iVar3._M_current = QUAL_LOWP;
      *(QUALIFIERS **)
       ((long)&pvVar4[1].
               super__Vector_base<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
               ._M_impl.super__Vector_impl_data + 8) = iVar3._M_current + 1;
    }
    pvVar4 = (this_00->
             super__Vector_base<std::vector<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>,_std::allocator<std::vector<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    local_1c = QUAL_UNIFORM;
    iVar3._M_current =
         *(pointer *)
          ((long)&pvVar4[1].
                  super__Vector_base<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
                  ._M_impl.super__Vector_impl_data + 8);
    if (iVar3._M_current ==
        *(pointer *)
         ((long)&pvVar4[1].
                 super__Vector_base<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
                 ._M_impl.super__Vector_impl_data + 0x10)) {
      std::
      vector<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
      ::_M_realloc_insert<gl4cts::GLSL420Pack::Utils::QUALIFIERS>(pvVar4 + 1,iVar3,&local_1c);
    }
    else {
      *iVar3._M_current = QUAL_UNIFORM;
      *(QUALIFIERS **)
       ((long)&pvVar4[1].
               super__Vector_base<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
               ._M_impl.super__Vector_impl_data + 8) = iVar3._M_current + 1;
    }
    pvVar4 = (this_00->
             super__Vector_base<std::vector<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>,_std::allocator<std::vector<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    local_1c = QUAL_LOCATION;
    iVar3._M_current =
         *(pointer *)
          ((long)&pvVar4[1].
                  super__Vector_base<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
                  ._M_impl.super__Vector_impl_data + 8);
    if (iVar3._M_current ==
        *(pointer *)
         ((long)&pvVar4[1].
                 super__Vector_base<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
                 ._M_impl.super__Vector_impl_data + 0x10)) {
      std::
      vector<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
      ::_M_realloc_insert<gl4cts::GLSL420Pack::Utils::QUALIFIERS>(pvVar4 + 1,iVar3,&local_1c);
    }
    else {
      *iVar3._M_current = QUAL_LOCATION;
      *(QUALIFIERS **)
       ((long)&pvVar4[1].
               super__Vector_base<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
               ._M_impl.super__Vector_impl_data + 8) = iVar3._M_current + 1;
    }
    pvVar4 = (this_00->
             super__Vector_base<std::vector<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>,_std::allocator<std::vector<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    local_1c = QUAL_HIGHP;
    iVar3._M_current =
         *(pointer *)
          ((long)&pvVar4[2].
                  super__Vector_base<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
                  ._M_impl.super__Vector_impl_data + 8);
    if (iVar3._M_current ==
        *(pointer *)
         ((long)&pvVar4[2].
                 super__Vector_base<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
                 ._M_impl.super__Vector_impl_data + 0x10)) {
      std::
      vector<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
      ::_M_realloc_insert<gl4cts::GLSL420Pack::Utils::QUALIFIERS>(pvVar4 + 2,iVar3,&local_1c);
    }
    else {
      *iVar3._M_current = QUAL_HIGHP;
      *(QUALIFIERS **)
       ((long)&pvVar4[2].
               super__Vector_base<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
               ._M_impl.super__Vector_impl_data + 8) = iVar3._M_current + 1;
    }
    pvVar4 = (this_00->
             super__Vector_base<std::vector<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>,_std::allocator<std::vector<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    local_1c = QUAL_LOCATION;
    iVar3._M_current =
         *(pointer *)
          ((long)&pvVar4[2].
                  super__Vector_base<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
                  ._M_impl.super__Vector_impl_data + 8);
    if (iVar3._M_current ==
        *(pointer *)
         ((long)&pvVar4[2].
                 super__Vector_base<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
                 ._M_impl.super__Vector_impl_data + 0x10)) {
      std::
      vector<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
      ::_M_realloc_insert<gl4cts::GLSL420Pack::Utils::QUALIFIERS>(pvVar4 + 2,iVar3,&local_1c);
    }
    else {
      *iVar3._M_current = QUAL_LOCATION;
      *(QUALIFIERS **)
       ((long)&pvVar4[2].
               super__Vector_base<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
               ._M_impl.super__Vector_impl_data + 8) = iVar3._M_current + 1;
    }
    pvVar4 = (this_00->
             super__Vector_base<std::vector<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>,_std::allocator<std::vector<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    local_1c = QUAL_UNIFORM;
    iVar3._M_current =
         *(pointer *)
          ((long)&pvVar4[2].
                  super__Vector_base<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
                  ._M_impl.super__Vector_impl_data + 8);
    if (iVar3._M_current ==
        *(pointer *)
         ((long)&pvVar4[2].
                 super__Vector_base<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
                 ._M_impl.super__Vector_impl_data + 0x10)) {
      std::
      vector<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
      ::_M_realloc_insert<gl4cts::GLSL420Pack::Utils::QUALIFIERS>(pvVar4 + 2,iVar3,&local_1c);
    }
    else {
      *iVar3._M_current = QUAL_UNIFORM;
      *(QUALIFIERS **)
       ((long)&pvVar4[2].
               super__Vector_base<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
               ._M_impl.super__Vector_impl_data + 8) = iVar3._M_current + 1;
    }
    pvVar4 = (this_00->
             super__Vector_base<std::vector<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>,_std::allocator<std::vector<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    local_1c = QUAL_LOCATION;
    iVar3._M_current =
         *(pointer *)
          ((long)&pvVar4[2].
                  super__Vector_base<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
                  ._M_impl.super__Vector_impl_data + 8);
    if (iVar3._M_current ==
        *(pointer *)
         ((long)&pvVar4[2].
                 super__Vector_base<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
                 ._M_impl.super__Vector_impl_data + 0x10)) {
      std::
      vector<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
      ::_M_realloc_insert<gl4cts::GLSL420Pack::Utils::QUALIFIERS>(pvVar4 + 2,iVar3,&local_1c);
    }
    else {
      *iVar3._M_current = QUAL_LOCATION;
      *(QUALIFIERS **)
       ((long)&pvVar4[2].
               super__Vector_base<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
               ._M_impl.super__Vector_impl_data + 8) = iVar3._M_current + 1;
    }
    pvVar4 = (this_00->
             super__Vector_base<std::vector<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>,_std::allocator<std::vector<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    local_1c = QUAL_LOCATION;
    iVar3._M_current =
         *(pointer *)
          ((long)&pvVar4[3].
                  super__Vector_base<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
                  ._M_impl.super__Vector_impl_data + 8);
    if (iVar3._M_current ==
        *(pointer *)
         ((long)&pvVar4[3].
                 super__Vector_base<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
                 ._M_impl.super__Vector_impl_data + 0x10)) {
      std::
      vector<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
      ::_M_realloc_insert<gl4cts::GLSL420Pack::Utils::QUALIFIERS>(pvVar4 + 3,iVar3,&local_1c);
    }
    else {
      *iVar3._M_current = QUAL_LOCATION;
      *(QUALIFIERS **)
       ((long)&pvVar4[3].
               super__Vector_base<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
               ._M_impl.super__Vector_impl_data + 8) = iVar3._M_current + 1;
    }
    pvVar4 = (this_00->
             super__Vector_base<std::vector<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>,_std::allocator<std::vector<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    local_1c = QUAL_LOWP;
    iVar3._M_current =
         *(pointer *)
          ((long)&pvVar4[3].
                  super__Vector_base<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
                  ._M_impl.super__Vector_impl_data + 8);
    if (iVar3._M_current ==
        *(pointer *)
         ((long)&pvVar4[3].
                 super__Vector_base<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
                 ._M_impl.super__Vector_impl_data + 0x10)) {
      std::
      vector<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
      ::_M_realloc_insert<gl4cts::GLSL420Pack::Utils::QUALIFIERS>(pvVar4 + 3,iVar3,&local_1c);
    }
    else {
      *iVar3._M_current = QUAL_LOWP;
      *(QUALIFIERS **)
       ((long)&pvVar4[3].
               super__Vector_base<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
               ._M_impl.super__Vector_impl_data + 8) = iVar3._M_current + 1;
    }
    pvVar4 = (this_00->
             super__Vector_base<std::vector<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>,_std::allocator<std::vector<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    local_1c = QUAL_UNIFORM;
    iVar3._M_current =
         *(pointer *)
          ((long)&pvVar4[3].
                  super__Vector_base<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
                  ._M_impl.super__Vector_impl_data + 8);
    if (iVar3._M_current ==
        *(pointer *)
         ((long)&pvVar4[3].
                 super__Vector_base<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
                 ._M_impl.super__Vector_impl_data + 0x10)) {
      std::
      vector<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
      ::_M_realloc_insert<gl4cts::GLSL420Pack::Utils::QUALIFIERS>(pvVar4 + 3,iVar3,&local_1c);
    }
    else {
      *iVar3._M_current = QUAL_UNIFORM;
      *(QUALIFIERS **)
       ((long)&pvVar4[3].
               super__Vector_base<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
               ._M_impl.super__Vector_impl_data + 8) = iVar3._M_current + 1;
    }
    pvVar4 = (this_00->
             super__Vector_base<std::vector<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>,_std::allocator<std::vector<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    local_1c = QUAL_LOCATION;
    iVar3._M_current =
         *(pointer *)
          ((long)&pvVar4[3].
                  super__Vector_base<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
                  ._M_impl.super__Vector_impl_data + 8);
    if (iVar3._M_current ==
        *(pointer *)
         ((long)&pvVar4[3].
                 super__Vector_base<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
                 ._M_impl.super__Vector_impl_data + 0x10)) {
      std::
      vector<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
      ::_M_realloc_insert<gl4cts::GLSL420Pack::Utils::QUALIFIERS>(pvVar4 + 3,iVar3,&local_1c);
    }
    else {
      *iVar3._M_current = QUAL_LOCATION;
      *(QUALIFIERS **)
       ((long)&pvVar4[3].
               super__Vector_base<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
               ._M_impl.super__Vector_impl_data + 8) = iVar3._M_current + 1;
    }
  }
  return bVar1;
}

Assistant:

bool QualifierOrderUniformTest::testInit()
{
	if (false == m_is_explicit_uniform_location)
	{
		return false;
	}

	m_test_cases.resize(4);

	m_test_cases[0].push_back(Utils::QUAL_HIGHP);
	m_test_cases[0].push_back(Utils::QUAL_UNIFORM);
	m_test_cases[0].push_back(Utils::QUAL_LOCATION);

	m_test_cases[1].push_back(Utils::QUAL_LOWP);
	m_test_cases[1].push_back(Utils::QUAL_UNIFORM);
	m_test_cases[1].push_back(Utils::QUAL_LOCATION);

	m_test_cases[2].push_back(Utils::QUAL_HIGHP);
	m_test_cases[2].push_back(Utils::QUAL_LOCATION);
	m_test_cases[2].push_back(Utils::QUAL_UNIFORM);
	m_test_cases[2].push_back(Utils::QUAL_LOCATION);

	m_test_cases[3].push_back(Utils::QUAL_LOCATION);
	m_test_cases[3].push_back(Utils::QUAL_LOWP);
	m_test_cases[3].push_back(Utils::QUAL_UNIFORM);
	m_test_cases[3].push_back(Utils::QUAL_LOCATION);

	return true;
}